

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::process_comments(CTcTokenizer *this,size_t start_ofs)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  tc_toktyp_t tVar5;
  char *pcVar6;
  char *pcVar7;
  long in_RSI;
  tok_embed_ctx *in_RDI;
  int i;
  int qcnt_1;
  int qcnt;
  wchar_t cur;
  int trailing_sp_after_bs;
  utf8_ptr dst;
  utf8_ptr src;
  size_t in_stack_ffffffffffffffa8;
  tok_embed_ctx *in_stack_ffffffffffffffb0;
  CTcTokString *this_00;
  int in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  int local_34;
  int local_2c;
  utf8_ptr local_20;
  utf8_ptr local_18;
  long local_10;
  
  local_10 = in_RSI;
  utf8_ptr::utf8_ptr(&local_18);
  utf8_ptr::utf8_ptr(&local_20);
  bVar1 = false;
  pcVar6 = CTcTokString::get_buf((CTcTokString *)(in_RDI->stk + 9));
  utf8_ptr::set(&local_18,pcVar6 + local_10);
  pcVar6 = CTcTokString::get_buf((CTcTokString *)(in_RDI->stk + 9));
  utf8_ptr::set(&local_20,pcVar6 + local_10);
  do {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e9fa4);
    if (wVar2 == L'\0') {
      this_00 = (CTcTokString *)(in_RDI->stk + 9);
      pcVar6 = utf8_ptr::getptr(&local_20);
      pcVar7 = CTcTokString::get_buf((CTcTokString *)(in_RDI->stk + 9));
      CTcTokString::set_text_len(this_00,(long)pcVar6 - (long)pcVar7);
      if (bVar1) {
        log_warning(0x274b);
      }
      return;
    }
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e9fb7);
    iVar3 = CTcTokStream::is_in_comment(*(CTcTokStream **)&in_RDI->stk[4].qu);
    if (iVar3 == 0) {
      if (in_RDI[1].stk[6].parens == 0) {
        if (wVar2 == L'\\') {
          bVar1 = true;
        }
        else {
          iVar3 = is_space(L'\0');
          if (iVar3 == 0) {
            bVar1 = false;
          }
        }
        if (wVar2 == L'/') {
          in_stack_ffffffffffffffbc =
               utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          if (in_stack_ffffffffffffffbc == L'*') {
            CTcTokStream::set_in_comment(*(CTcTokStream **)&in_RDI->stk[4].qu,1);
          }
          else if (in_stack_ffffffffffffffbc == L'/') {
            utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                            (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
            return;
          }
        }
        else if ((wVar2 == L'\"') || (wVar2 == L'\'')) {
          in_RDI[1].stk[6].parens = wVar2;
          iVar3 = count_quotes((utf8_ptr *)in_stack_ffffffffffffffb0,
                               (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
          in_RDI[1].stk[6].endtok = (uint)(2 < iVar3);
          if (in_RDI[1].stk[6].endtok != TOKT_INVALID) {
            utf8_ptr::inc_by((utf8_ptr *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                            (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
            utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                            (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
          }
        }
        else if (L'\b' < wVar2) {
          iVar3 = tok_embed_ctx::in_expr((tok_embed_ctx *)&in_RDI[1].stk[6].qu);
          if ((iVar3 == 0) || ((wVar2 != L'(' && (wVar2 != L')')))) {
            iVar3 = tok_embed_ctx::in_expr((tok_embed_ctx *)&in_RDI[1].stk[6].qu);
            if ((iVar3 != 0) &&
               (((iVar3 = tok_embed_ctx::parens(in_stack_ffffffffffffffb0), iVar3 == 0 &&
                 (wVar2 == L'>')) &&
                (wVar2 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffffb0,
                                            in_stack_ffffffffffffffa8), wVar2 == L'>')))) {
              wVar2 = tok_embed_ctx::qu(in_stack_ffffffffffffffb0);
              in_RDI[1].stk[6].parens = wVar2;
              tVar5 = tok_embed_ctx::triple(in_stack_ffffffffffffffb0);
              in_RDI[1].stk[6].endtok = tVar5;
              tok_embed_ctx::end_expr((tok_embed_ctx *)&in_RDI[1].stk[6].qu);
              utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
              utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                              (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
            }
          }
          else {
            tok_embed_ctx::parens
                      (in_stack_ffffffffffffffb0,(int)(in_stack_ffffffffffffffa8 >> 0x20));
          }
        }
      }
      else if (wVar2 == L'\\') {
        utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
        utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                        (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
        wVar2 = utf8_ptr::getch((utf8_ptr *)0x2ea08a);
        if ((in_RDI[1].stk[6].endtok != TOKT_INVALID) && (wVar2 == in_RDI[1].stk[6].parens)) {
          for (local_2c = count_quotes((utf8_ptr *)in_stack_ffffffffffffffb0,
                                       (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20)); 1 < local_2c;
              local_2c = local_2c + -1) {
            utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                            (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
            utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
          }
        }
      }
      else if (wVar2 == in_RDI[1].stk[6].parens) {
        if (in_RDI[1].stk[6].endtok == TOKT_INVALID) {
          in_RDI[1].stk[6].parens = 0;
        }
        else {
          iVar3 = count_quotes((utf8_ptr *)in_stack_ffffffffffffffb0,
                               (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
          if (2 < iVar3) {
            local_34 = 1;
            while (local_34 < iVar3) {
              utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                              (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
              local_34 = local_34 + 1;
              utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
            }
            in_RDI[1].stk[6].parens = 0;
          }
        }
      }
      else if ((wVar2 == L'<') &&
              (wVar2 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffffb0,
                                          in_stack_ffffffffffffffa8), wVar2 == L'<')) {
        utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
        tok_embed_ctx::start_expr
                  (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        in_RDI[1].stk[6].parens = 0;
        utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                        (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
      }
      utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffffb0,
                      (wchar_t)(in_stack_ffffffffffffffa8 >> 0x20));
    }
    else if ((wVar2 == L'*') &&
            (wVar4 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffffb0,
                                        in_stack_ffffffffffffffa8), wVar4 == L'/')) {
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
      CTcTokStream::set_in_comment(*(CTcTokStream **)&in_RDI->stk[4].qu,0);
    }
    else if ((wVar2 == L'/') &&
            ((wVar2 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffffb0,
                                         in_stack_ffffffffffffffa8), wVar2 == L'*' &&
             (iVar3 = CTcParser::get_syntax_only(G_prs), iVar3 == 0)))) {
      log_warning(0x274d);
    }
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffffb0);
  } while( true );
}

Assistant:

void CTcTokenizer::process_comments(size_t start_ofs)
{
    utf8_ptr src;
    utf8_ptr dst;
    
    /* we haven't found a backslash followed by trailing space yet */
    int trailing_sp_after_bs = FALSE;

    /* 
     *   Scan the line.  When inside a comment, replace each character of
     *   the comment with a space.  When outside comments, simply copy
     *   characters intact.
     *   
     *   Note that we need a separate src and dst pointer, because the
     *   character length of the original and replaced characters may
     *   change.  Fortunately, the length will never do anything but
     *   shrink or stay the same, since the only change we make is to
     *   insert spaces, which are always one byte apiece in UTF-8; we can
     *   therefore update the buffer in place.  
     */
    for (src.set(linebuf_.get_buf() + start_ofs),
         dst.set(linebuf_.get_buf() + start_ofs) ;
         src.getch() != '\0' ; src.inc())
    {
        /* get the current character */
        wchar_t cur = src.getch();

        /* check to see if we're in a comment */
        if (str_->is_in_comment())
        {
            /* 
             *   check to see if the comment is ending, or if we have an
             *   apparent nested comment (which isn't allowed)
             */
            if (cur == '*' && src.getch_at(1) == '/')
            {
                /* 
                 *   skip an extra character of the source - we'll skip
                 *   one in the main loop, so we only need to skip one
                 *   more now 
                 */
                src.inc();
                
                /* we're no longer in a comment */
                str_->set_in_comment(FALSE);
            }
            else if (cur == '/' && src.getch_at(1) == '*')
            {
                /* looks like a nested comment - warn about it */
                if (!G_prs->get_syntax_only())
                    log_warning(TCERR_NESTED_COMMENT);
            }

            /* continue without copying anything from inside the comment */
            continue;
        }
        else if (in_quote_ != '\0')
        {
            /* see what we have */
            if (cur == '\\')
            {
                /* 
                 *   It's a backslash sequence -- copy the backslash to
                 *   the output, and skip it.  Note that we don't have to
                 *   worry about the line ending with a backslash, since
                 *   the line reader will already have considered that to
                 *   be a line splice.  
                 */
                src.inc();
                dst.setch(cur);

                /* get the next character, so we copy it directly */
                cur = src.getch();

                /* 
                 *   if we're in a triple-quoted string, and this is an
                 *   escaped quote, the backslash escapes a whole run of
                 *   consecutive quotes that follow 
                 */
                if (in_triple_ && cur == in_quote_)
                {
                    /* copy and skip any run of quotes, minus the last one */
                    for (int qcnt = count_quotes(&src, cur) ; qcnt > 1 ;
                         dst.setch(cur), src.inc(), --qcnt) ;
                }
            }
            else if (cur == in_quote_)
            {
                /* This is the close quote.  Check for triple quotes. */
                if (in_triple_)
                {
                    /* triple-quoted - we need three quotes in a row */
                    int qcnt = count_quotes(&src, cur);
                    if (qcnt >= 3)
                    {
                        /* copy and skip all but the last in the run */
                        for (int i = 1 ; i < qcnt ; ++i, src.inc())
                            dst.setch(cur);

                        /* close the string */
                        in_quote_ = '\0';
                    }
                }
                else
                {
                    /* regular string, so it ends at the matching quote */
                    in_quote_ = '\0';
                }
            }
            else if (cur == '<' && src.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starting point - skip the
                 *   first of the '<' characters (the enclosing loop will
                 *   skip the second one)
                 */
                src.inc();

                /* we're in an embedding now */
                comment_in_embedding_.start_expr(in_quote_, in_triple_, FALSE);

                /* the string is done for now */
                in_quote_ = '\0';

                /* copy the extra '<' to the output */
                dst.setch('<');
            }
        }
        else
        {
            /*
             *   Monitor the stream for a backslash followed by trailing
             *   spaces.  If this is a backslash, note that we might have a
             *   backslash with trailing spaces; if it's a space, we might
             *   still have this, so leave the flag alone; if it's anything
             *   else, clear the flag, since we've found something other
             *   than backslashes and spaces.  
             */
            if (cur == '\\')
                trailing_sp_after_bs = TRUE;
            else if (!is_space(cur))
                trailing_sp_after_bs = FALSE;
            
            /* check to see if we're starting a comment */
            if (cur == '/')
            {
                switch(src.getch_at(1))
                {
                case '*':
                    /* note that we're starting a comment */
                    str_->set_in_comment(TRUE);

                    /* 
                     *   replace the starting slash with a space - this
                     *   will effectively replace the entire comment with
                     *   a single space, since we won't copy anything else
                     *   from inside the comment 
                     */
                    cur = ' ';
                    break;

                case '/':
                    /* 
                     *   comment to end of line - we can terminate the
                     *   line at the opening slash and return immediately,
                     *   because the entire rest of the line is to be
                     *   ignored 
                     */
                    dst.setch('\0');
                    return;

                default:
                    /* not a comment - copy it as-is */
                    break;
                }
            }
            else if (cur == '"' || cur == '\'')
            {
                /* it's the start of a new string */
                in_quote_ = cur;

                /* check for triple quotes */
                in_triple_ = (count_quotes(&src, cur) >= 3);

                /* if in triple quotes, copy and skip the extra two qutoes */
                if (in_triple_)
                {
                    src.inc_by(2);
                    dst.setch(cur);
                    dst.setch(cur);
                }
            }
            else if (cur < 0x09)
            {
                /* 
                 *   it's a special flag character - we need to guarantee
                 *   that this character never occurs in input (it
                 *   shouldn't anyway, since it's a control character), so
                 *   translate it to a space 
                 */
                cur = ' ';
            }
            else if (comment_in_embedding_.in_expr()
                     && (cur == '(' || cur == ')'))
            {
                /* adjust the paren level in an embedded expression */
                comment_in_embedding_.parens(cur == '(' ? 1 : -1);
            }
            else if (comment_in_embedding_.in_expr()
                     && comment_in_embedding_.parens() == 0
                     && cur == '>' && src.getch_at(1) == '>')
            {
                /* it's the end of an embedded expression */
                in_quote_ = comment_in_embedding_.qu();
                in_triple_ = comment_in_embedding_.triple();
                comment_in_embedding_.end_expr();

                /* skip the extra '>' and copy it to the output */
                src.inc();
                dst.setch('>');
            }
        }

        /* set the current character in the output */
        dst.setch(cur);
    }

    /* set the updated line buffer length */
    linebuf_.set_text_len(dst.getptr() - linebuf_.get_buf());

    /* 
     *   if we found a backslash with nothing following but whitespace, flag
     *   a warning, since they might have meant the backslash as a line
     *   continuation signal, but we're not interpreting it that way because
     *   of the trailing whitespace 
     */
    if (trailing_sp_after_bs)
        log_warning(TCERR_TRAILING_SP_AFTER_BS);
}